

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::InternalFindExtensionByNumberNoLock
          (DescriptorPool *this,Descriptor *extendee,int number)

{
  FieldDescriptor *pFVar1;
  
  if (extendee->extension_range_count_ == 0) {
    return (FieldDescriptor *)0x0;
  }
  pFVar1 = Tables::FindExtension
                     ((this->tables_)._M_t.
                      super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                      .super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>.
                      _M_head_impl,extendee,number);
  if (pFVar1 == (FieldDescriptor *)0x0) {
    if ((this->underlay_ != (DescriptorPool *)0x0) &&
       (pFVar1 = InternalFindExtensionByNumberNoLock(this->underlay_,extendee,number),
       pFVar1 != (FieldDescriptor *)0x0)) {
      return pFVar1;
    }
    pFVar1 = (FieldDescriptor *)0x0;
  }
  return pFVar1;
}

Assistant:

const FieldDescriptor* DescriptorPool::InternalFindExtensionByNumberNoLock(
    const Descriptor* extendee, int number) const {
  if (extendee->extension_range_count() == 0) return nullptr;

  const FieldDescriptor* result = tables_->FindExtension(extendee, number);
  if (result != nullptr) {
    return result;
  }

  if (underlay_ != nullptr) {
    result = underlay_->InternalFindExtensionByNumberNoLock(extendee, number);
    if (result != nullptr) return result;
  }

  return nullptr;
}